

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_tattle(REF_GRID ref_grid,REF_INT node)

{
  REF_GEOM ref_geom_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT group;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_grid_local._4_4_ = ref_node_location(ref_grid->node,node);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_geom_tattle(ref_geom_00,node);
    if (ref_grid_local._4_4_ == 0) {
      ref_private_macro_code_rss_1 = 0;
      _ref_private_macro_code_rss = ref_grid->cell[0];
      while (ref_private_macro_code_rss_1 < 0x10) {
        uVar1 = ref_cell_tattle_about(_ref_private_macro_code_rss,node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x113,"ref_grid_tattle",(ulong)uVar1,"cell tatt");
          return uVar1;
        }
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
        _ref_private_macro_code_rss = ref_grid->cell[ref_private_macro_code_rss_1];
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x111,
             "ref_grid_tattle",(ulong)ref_grid_local._4_4_,"geom tatt");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x110,
           "ref_grid_tattle",(ulong)ref_grid_local._4_4_,"loc");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tattle(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  RSS(ref_node_location(ref_node, node), "loc");
  RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
  }
  return REF_SUCCESS;
}